

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

void __thiscall FileTokenizer::skipWhitespace(FileTokenizer *this)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  ulong uVar4;
  string local_c8;
  Token local_a8;
  allocator<char> local_31;
  string local_30;
  FileTokenizer *local_10;
  FileTokenizer *this_local;
  
  local_10 = this;
  while( true ) {
    while( true ) {
      while (bVar2 = isWhitespace(&this->currentLine,this->linePos), bVar2) {
        do {
          this->linePos = this->linePos + 1;
          bVar2 = isWhitespace(&this->currentLine,this->linePos);
        } while (bVar2);
      }
      bVar2 = isComment(&this->currentLine,this->linePos);
      if (!bVar2) break;
      sVar3 = std::__cxx11::string::size();
      this->linePos = sVar3;
    }
    bVar2 = isBlockComment(&this->currentLine,this->linePos);
    if (!bVar2) break;
    this->linePos = this->linePos + 2;
    while (bVar2 = isBlockCommentEnd(&this->currentLine,this->linePos), ((bVar2 ^ 0xffU) & 1) != 0)
    {
      this->linePos = this->linePos + 1;
      uVar1 = this->linePos;
      uVar4 = std::__cxx11::string::size();
      if (uVar4 <= uVar1) {
        bVar2 = isInputAtEnd(this);
        if (bVar2) {
          sVar3 = this->linePos;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_30,"Unexpected end of file in block comment",&local_31);
          createToken(this,Invalid,sVar3,&local_30);
          std::__cxx11::string::~string((string *)&local_30);
          std::allocator<char>::~allocator(&local_31);
          Token::Token(&local_a8,&this->token);
          Tokenizer::addToken(&this->super_Tokenizer,&local_a8);
          Token::~Token(&local_a8);
          return;
        }
        TextFile::readLine_abi_cxx11_(&local_c8,this->input);
        std::__cxx11::string::operator=((string *)&this->currentLine,(string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        this->linePos = 0;
        this->lineNumber = this->lineNumber + 1;
      }
    }
    this->linePos = this->linePos + 2;
  }
  return;
}

Assistant:

void FileTokenizer::skipWhitespace()
{
	while (true)
	{
		if (isWhitespace(currentLine,linePos))
		{
			do { linePos++; } while (isWhitespace(currentLine,linePos));
		} else if (isComment(currentLine,linePos))
		{
			linePos = currentLine.size();
		} else if (isBlockComment(currentLine,linePos))
		{
			linePos += 2;
			while(!isBlockCommentEnd(currentLine,linePos))
			{
				linePos++;
				if (linePos >= currentLine.size())
				{
					if (isInputAtEnd())
					{
						createToken(TokenType::Invalid,linePos, "Unexpected end of file in block comment");
						addToken(token);
						return;
					}
					currentLine = input->readLine();
					linePos = 0;
					lineNumber++;
				}
			}
			linePos += 2;
		} else
		{
			break;
		}
	}
}